

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuProcessImage.h
# Opt level: O0

void __thiscall
gpu::ImageProcessing<unsigned_char>::applyConvolution
          (ImageProcessing<unsigned_char> *this,uchar *inputBuffer,uchar *outputBuffer,int *kernel,
          int imageWidth,int imageHeight,int spectrum,int kernelSize,int normal)

{
  int *in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int offset;
  int i;
  int j;
  int channel;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < in_stack_00000008; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
      for (local_3c = 0; local_3c < in_R9D; local_3c = local_3c + 1) {
        ConvolutionFilters<unsigned_char>::applyConvolution
                  ((ConvolutionFilters<unsigned_char> *)(in_RDI + 0x10),in_RSI,in_RDX,in_RCX,in_R8D,
                   in_R9D,in_stack_00000010,in_stack_00000018,
                   local_34 * in_R8D * in_R9D + local_3c * in_R8D + local_38,local_34);
      }
    }
  }
  return;
}

Assistant:

void ImageProcessing<T>::applyConvolution(T *inputBuffer, 
                                              T *outputBuffer, 
                                              int *kernel, 
                                              int imageWidth,
                                              int imageHeight, 
                                              int spectrum,
                                              int kernelSize,
                                              int normal)                                   
    {


      for(int channel = 0; channel < spectrum ; ++channel)
      {
        for(int j = 0; j < imageWidth; ++j)
        {
          for(int i = 0; i < imageHeight; ++i)
          {
            int offset = channel*imageWidth*imageHeight +  i * imageWidth + j;
            convolutionFilter.applyConvolution(inputBuffer,outputBuffer,kernel,imageWidth,imageHeight,kernelSize,normal,offset,channel);
          }
        }
      }
    }